

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::TextBasedObject::Copy(TextBasedObject *this,TextBasedObject *rhs)

{
  undefined8 uVar1;
  
  InterchangeObject::Copy((InterchangeObject *)this,(InterchangeObject *)rhs);
  (this->super_DescriptiveObject).LinkedDescriptiveObjectPlugInId.m_property.super_Identifier<16U>.
  m_HasValue = (rhs->super_DescriptiveObject).LinkedDescriptiveObjectPlugInId.m_property.
               super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)
           ((rhs->super_DescriptiveObject).LinkedDescriptiveObjectPlugInId.m_property.
            super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)
   (this->super_DescriptiveObject).LinkedDescriptiveObjectPlugInId.m_property.super_Identifier<16U>.
   m_Value = *(undefined8 *)
              (rhs->super_DescriptiveObject).LinkedDescriptiveObjectPlugInId.m_property.
              super_Identifier<16U>.m_Value;
  *(undefined8 *)
   ((this->super_DescriptiveObject).LinkedDescriptiveObjectPlugInId.m_property.super_Identifier<16U>
    .m_Value + 8) = uVar1;
  (this->super_DescriptiveObject).LinkedDescriptiveObjectPlugInId.m_has_value =
       (rhs->super_DescriptiveObject).LinkedDescriptiveObjectPlugInId.m_has_value;
  (this->PayloadSchemeID).super_Identifier<16U>.m_HasValue =
       (rhs->PayloadSchemeID).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->PayloadSchemeID).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->PayloadSchemeID).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->PayloadSchemeID).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->PayloadSchemeID).super_Identifier<16U>.m_Value + 8) = uVar1;
  std::__cxx11::string::_M_assign((string *)&(this->TextMIMEMediaType).super_string);
  std::__cxx11::string::_M_assign((string *)&(this->RFC5646TextLanguageCode).super_string);
  std::__cxx11::string::_M_assign((string *)&(this->TextDataDescription).m_property.super_string);
  (this->TextDataDescription).m_has_value = (rhs->TextDataDescription).m_has_value;
  return;
}

Assistant:

void
TextBasedObject::Copy(const TextBasedObject& rhs)
{
  DescriptiveObject::Copy(rhs);
  PayloadSchemeID = rhs.PayloadSchemeID;
  TextMIMEMediaType = rhs.TextMIMEMediaType;
  RFC5646TextLanguageCode = rhs.RFC5646TextLanguageCode;
  TextDataDescription = rhs.TextDataDescription;
}